

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O3

idx_t __thiscall
duckdb::LocalStorage::Delete(LocalStorage *this,DataTable *table,Vector *row_ids,idx_t count)

{
  row_t *ids;
  TransactionData transaction;
  bool bVar1;
  RowGroupCollection *pRVar2;
  idx_t iVar3;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  optional_ptr<duckdb::LocalTableStorage,_true> local_50;
  TransactionData local_48;
  
  local_50 = LocalTableManager::GetStorage(&this->table_manager,table);
  optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_50);
  bVar1 = TableIndexList::Empty(&(local_50.ptr)->append_indexes);
  if (!bVar1) {
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_50);
    pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_50.ptr)->row_groups);
    optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_50);
    RowGroupCollection::RemoveFromIndexes(pRVar2,&(local_50.ptr)->append_indexes,row_ids,count);
  }
  ids = (row_t *)row_ids->data;
  optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_50);
  pRVar2 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&(local_50.ptr)->row_groups);
  TransactionData::TransactionData(&local_48,0,0);
  transaction.transaction_id = local_48.transaction_id;
  transaction.transaction.ptr = local_48.transaction.ptr;
  transaction.start_time = local_48.start_time;
  iVar3 = RowGroupCollection::Delete(pRVar2,transaction,table,ids,count);
  optional_ptr<duckdb::LocalTableStorage,_true>::CheckValid(&local_50);
  (local_50.ptr)->deleted_rows = (local_50.ptr)->deleted_rows + iVar3;
  return iVar3;
}

Assistant:

idx_t LocalStorage::Delete(DataTable &table, Vector &row_ids, idx_t count) {
	auto storage = table_manager.GetStorage(table);
	D_ASSERT(storage);

	// delete from unique indices (if any)
	if (!storage->append_indexes.Empty()) {
		storage->row_groups->RemoveFromIndexes(storage->append_indexes, row_ids, count);
	}

	auto ids = FlatVector::GetData<row_t>(row_ids);
	idx_t delete_count = storage->row_groups->Delete(TransactionData(0, 0), table, ids, count);
	storage->deleted_rows += delete_count;
	return delete_count;
}